

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector_hybrid.cpp
# Opt level: O2

void embree::avx2::
     BVHNIntersectorKHybrid<8,_4,_1,_false,_embree::avx2::ArrayIntersectorK_1<4,_embree::avx2::QuadMvIntersectorKMoeller<4,_4,_false>_>,_true>
     ::occluded(vint<4> *valid_i,Intersectors *This,RayK<4> *ray,RayQueryContext *context)

{
  RayK<4> *pRVar1;
  RayK<4> *pRVar2;
  RayK<4> *pRVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  BVH *bvh;
  size_t sVar9;
  anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 aVar10;
  undefined1 auVar11 [16];
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  ulong uVar19;
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  size_t sVar26;
  bool bVar27;
  uint uVar28;
  undefined4 uVar29;
  int iVar30;
  long lVar31;
  uint uVar32;
  size_t sVar33;
  long lVar34;
  anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 *paVar35;
  NodeRef root;
  long lVar36;
  NodeRef *pNVar37;
  ulong uVar38;
  vint4 ai_2;
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 in_ZMM0 [64];
  vint4 ai;
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [64];
  vint4 bi_3;
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  float fVar62;
  float fVar65;
  float fVar66;
  vint4 bi_2;
  undefined1 auVar63 [16];
  float fVar67;
  undefined1 auVar64 [16];
  vint4 bi_1;
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  vint4 ai_1;
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  vint4 ai_3;
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  uint uVar91;
  uint uVar92;
  vint4 bi;
  undefined1 auVar88 [16];
  uint uVar93;
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [64];
  anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 aVar100;
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  Precalculations pre;
  vbool<4> terminated;
  undefined1 local_3788 [16];
  undefined1 local_3758 [8];
  float fStack_3750;
  float fStack_374c;
  undefined1 local_3748 [8];
  float fStack_3740;
  float fStack_373c;
  undefined1 local_3738 [8];
  float fStack_3730;
  float fStack_372c;
  float local_36e8;
  float fStack_36e4;
  float fStack_36e0;
  float fStack_36dc;
  float local_36d8;
  float fStack_36d4;
  float fStack_36d0;
  float fStack_36cc;
  TravRayK<4,_false> tray;
  NodeRef stack_node [561];
  vfloat<4> stack_near [561];
  
  bvh = (BVH *)This->ptr;
  stack_node[1].ptr = (bvh->root).ptr;
  if (stack_node[1].ptr != 8) {
    if ((context->user != (RTCRayQueryContext *)0x0) &&
       ((context->args->flags & RTC_RAY_QUERY_FLAG_COHERENT) != RTC_RAY_QUERY_FLAG_INCOHERENT)) {
      occludedCoherent(valid_i,This,ray,context);
      return;
    }
    auVar61 = vpcmpeqd_avx(in_ZMM0._0_16_,in_ZMM0._0_16_);
    auVar63 = vpcmpeqd_avx(auVar61,(undefined1  [16])valid_i->field_0);
    auVar48 = ZEXT816(0) << 0x40;
    auVar11 = vcmpps_avx(*(undefined1 (*) [16])(ray + 0x80),auVar48,5);
    auVar68 = auVar63 & auVar11;
    if ((((auVar68 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
         (auVar68 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
        (auVar68 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) || auVar68[0xf] < '\0')
    {
      auVar11 = vandps_avx(auVar11,auVar63);
      tray.org.field_0._0_4_ = *(undefined4 *)ray;
      tray.org.field_0._4_4_ = *(undefined4 *)(ray + 4);
      tray.org.field_0._8_4_ = *(undefined4 *)(ray + 8);
      tray.org.field_0._12_4_ = *(undefined4 *)(ray + 0xc);
      tray.org.field_0._16_4_ = *(undefined4 *)(ray + 0x10);
      tray.org.field_0._20_4_ = *(undefined4 *)(ray + 0x14);
      tray.org.field_0._24_4_ = *(undefined4 *)(ray + 0x18);
      tray.org.field_0._28_4_ = *(undefined4 *)(ray + 0x1c);
      tray.org.field_0._32_4_ = *(undefined4 *)(ray + 0x20);
      tray.org.field_0._36_4_ = *(undefined4 *)(ray + 0x24);
      tray.org.field_0._40_4_ = *(undefined4 *)(ray + 0x28);
      tray.org.field_0._44_4_ = *(undefined4 *)(ray + 0x2c);
      tray.dir.field_0.field_0.x.field_0 = (vfloat_impl<4>)*(undefined1 (*) [16])(ray + 0x40);
      tray.dir.field_0.field_0.y.field_0 = (vfloat_impl<4>)*(undefined1 (*) [16])(ray + 0x50);
      tray.dir.field_0.field_0.z.field_0 = (vfloat_impl<4>)*(undefined1 (*) [16])(ray + 0x60);
      auVar104._8_4_ = 0x7fffffff;
      auVar104._0_8_ = 0x7fffffff7fffffff;
      auVar104._12_4_ = 0x7fffffff;
      auVar63 = vandps_avx(auVar104,(undefined1  [16])tray.dir.field_0.field_0.x.field_0);
      auVar94._8_4_ = 0x219392ef;
      auVar94._0_8_ = 0x219392ef219392ef;
      auVar94._12_4_ = 0x219392ef;
      auVar63 = vcmpps_avx(auVar63,auVar94,1);
      auVar68 = vblendvps_avx((undefined1  [16])tray.dir.field_0.field_0.x.field_0,auVar94,auVar63);
      auVar63 = vandps_avx(auVar104,(undefined1  [16])tray.dir.field_0.field_0.y.field_0);
      auVar63 = vcmpps_avx(auVar63,auVar94,1);
      auVar69 = vblendvps_avx((undefined1  [16])tray.dir.field_0.field_0.y.field_0,auVar94,auVar63);
      auVar63 = vandps_avx((undefined1  [16])tray.dir.field_0.field_0.z.field_0,auVar104);
      auVar63 = vcmpps_avx(auVar63,auVar94,1);
      auVar63 = vblendvps_avx((undefined1  [16])tray.dir.field_0.field_0.z.field_0,auVar94,auVar63);
      auVar74 = vrcpps_avx(auVar68);
      auVar95._8_4_ = 0x3f800000;
      auVar95._0_8_ = 0x3f8000003f800000;
      auVar95._12_4_ = 0x3f800000;
      auVar68 = vfnmadd213ps_fma(auVar68,auVar74,auVar95);
      tray.rdir.field_0.field_0.x.field_0 = (vfloat_impl<4>)vfmadd132ps_fma(auVar68,auVar74,auVar74)
      ;
      auVar68 = vrcpps_avx(auVar69);
      auVar69 = vfnmadd213ps_fma(auVar69,auVar68,auVar95);
      tray.rdir.field_0.field_0.y.field_0 = (vfloat_impl<4>)vfmadd132ps_fma(auVar69,auVar68,auVar68)
      ;
      auVar68 = vrcpps_avx(auVar63);
      auVar63 = vfnmadd213ps_fma(auVar63,auVar68,auVar95);
      tray.rdir.field_0.field_0.z.field_0 = (vfloat_impl<4>)vfmadd132ps_fma(auVar63,auVar68,auVar68)
      ;
      tray.org_rdir.field_0._0_4_ = tray.rdir.field_0._0_4_ * (float)tray.org.field_0._0_4_;
      tray.org_rdir.field_0._4_4_ = tray.rdir.field_0._4_4_ * (float)tray.org.field_0._4_4_;
      tray.org_rdir.field_0._8_4_ = tray.rdir.field_0._8_4_ * (float)tray.org.field_0._8_4_;
      tray.org_rdir.field_0._12_4_ = tray.rdir.field_0._12_4_ * (float)tray.org.field_0._12_4_;
      tray.org_rdir.field_0._16_4_ = (float)tray.org.field_0._16_4_ * tray.rdir.field_0._16_4_;
      tray.org_rdir.field_0._20_4_ = (float)tray.org.field_0._20_4_ * tray.rdir.field_0._20_4_;
      tray.org_rdir.field_0._24_4_ = (float)tray.org.field_0._24_4_ * tray.rdir.field_0._24_4_;
      tray.org_rdir.field_0._28_4_ = (float)tray.org.field_0._28_4_ * tray.rdir.field_0._28_4_;
      tray.org_rdir.field_0._32_4_ = (float)tray.org.field_0._32_4_ * tray.rdir.field_0._32_4_;
      tray.org_rdir.field_0._36_4_ = (float)tray.org.field_0._36_4_ * tray.rdir.field_0._36_4_;
      tray.org_rdir.field_0._40_4_ = (float)tray.org.field_0._40_4_ * tray.rdir.field_0._40_4_;
      tray.org_rdir.field_0._44_4_ = (float)tray.org.field_0._44_4_ * tray.rdir.field_0._44_4_;
      auVar63 = vcmpps_avx((undefined1  [16])tray.rdir.field_0.field_0.x.field_0,auVar48,1);
      auVar68._8_4_ = 0x20;
      auVar68._0_8_ = 0x2000000020;
      auVar68._12_4_ = 0x20;
      tray.nearXYZ.field_0.field_0.x.field_0 = (vint_impl<4>)vandps_avx(auVar63,auVar68);
      auVar63 = vcmpps_avx((undefined1  [16])tray.rdir.field_0.field_0.y.field_0,auVar48,5);
      auVar69._8_4_ = 0x40;
      auVar69._0_8_ = 0x4000000040;
      auVar69._12_4_ = 0x40;
      auVar74._8_4_ = 0x60;
      auVar74._0_8_ = 0x6000000060;
      auVar74._12_4_ = 0x60;
      tray.nearXYZ.field_0.field_0.y.field_0 = (vint_impl<4>)vblendvps_avx(auVar74,auVar69,auVar63);
      auVar63 = vcmpps_avx((undefined1  [16])tray.rdir.field_0.field_0.z.field_0,auVar48,5);
      auVar75._8_4_ = 0x80;
      auVar75._0_8_ = 0x8000000080;
      auVar75._12_4_ = 0x80;
      auVar79._8_4_ = 0xa0;
      auVar79._0_8_ = 0xa0000000a0;
      auVar79._12_4_ = 0xa0;
      tray.nearXYZ.field_0.field_0.z.field_0 = (vint_impl<4>)vblendvps_avx(auVar79,auVar75,auVar63);
      auVar63 = vmaxps_avx(*(undefined1 (*) [16])(ray + 0x30),auVar48);
      auVar68 = vmaxps_avx(*(undefined1 (*) [16])(ray + 0x80),auVar48);
      stack_near[0].field_0.i[2] = 0x7f800000;
      stack_near[0].field_0._0_8_ = 0x7f8000007f800000;
      stack_near[0].field_0.i[3] = 0x7f800000;
      auVar99 = ZEXT1664((undefined1  [16])stack_near[0].field_0);
      tray.tnear.field_0 =
           (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
           vblendvps_avx((undefined1  [16])stack_near[0].field_0,auVar63,auVar11);
      auVar55 = ZEXT1664((undefined1  [16])tray.tnear.field_0);
      auVar63._8_4_ = 0xff800000;
      auVar63._0_8_ = 0xff800000ff800000;
      auVar63._12_4_ = 0xff800000;
      tray.tfar.field_0 =
           (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)vblendvps_avx(auVar63,auVar68,auVar11);
      terminated.field_0.i[1] = auVar11._4_4_ ^ auVar61._4_4_;
      terminated.field_0.i[0] = auVar11._0_4_ ^ auVar61._0_4_;
      terminated.field_0.i[2] = auVar11._8_4_ ^ auVar61._8_4_;
      terminated.field_0.i[3] = auVar11._12_4_ ^ auVar61._12_4_;
      if (context->user == (RTCRayQueryContext *)0x0) {
        uVar32 = 3;
      }
      else {
        uVar32 = ((context->args->flags & RTC_RAY_QUERY_FLAG_COHERENT) ==
                 RTC_RAY_QUERY_FLAG_INCOHERENT) + 2;
      }
      pNVar37 = stack_node + 2;
      stack_node[0].ptr = 0xfffffffffffffff8;
      paVar35 = &stack_near[2].field_0;
      stack_near[1].field_0 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)tray.tnear;
LAB_0163b46e:
      do {
        do {
          root.ptr = pNVar37[-1].ptr;
          if (root.ptr == 0xfffffffffffffff8) goto LAB_0163bde6;
          pNVar37 = pNVar37 + -1;
          paVar35 = paVar35 + -1;
          aVar100 = *paVar35;
          auVar61 = vcmpps_avx((undefined1  [16])aVar100,(undefined1  [16])tray.tfar.field_0,1);
          uVar28 = vmovmskps_avx(auVar61);
        } while (uVar28 == 0);
        uVar38 = (ulong)(uVar28 & 0xff);
        uVar28 = POPCOUNT(uVar28 & 0xff);
        if (uVar32 < uVar28) {
LAB_0163b4b3:
          do {
            if ((root.ptr & 8) != 0) {
              if (root.ptr == 0xfffffffffffffff8) goto LAB_0163bde6;
              auVar61 = vcmpps_avx((undefined1  [16])tray.tfar.field_0,(undefined1  [16])aVar100,6);
              if ((((auVar61 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
                   (auVar61 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                  (auVar61 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                  -1 < auVar61[0xf]) goto LAB_0163b46e;
              local_3788._0_8_ = terminated.field_0._0_8_ ^ 0xffffffffffffffff;
              local_3788._8_4_ = terminated.field_0.i[2] ^ 0xffffffff;
              local_3788._12_4_ = terminated.field_0.i[3] ^ 0xffffffff;
              pRVar1 = ray + 0x50;
              pRVar2 = ray + 0x60;
              pRVar3 = ray + 0x40;
              lVar36 = (root.ptr & 0xfffffffffffffff0) + 0xc0;
              lVar31 = 0;
              goto LAB_0163b726;
            }
            sVar33 = 8;
            aVar100 = auVar99._0_16_;
            for (lVar31 = 0;
                (lVar31 != 8 &&
                (sVar9 = *(size_t *)((root.ptr & 0xfffffffffffffff0) + lVar31 * 8), sVar9 != 8));
                lVar31 = lVar31 + 1) {
              uVar29 = *(undefined4 *)(root.ptr + 0x40 + lVar31 * 4);
              auVar47._4_4_ = uVar29;
              auVar47._0_4_ = uVar29;
              auVar47._8_4_ = uVar29;
              auVar47._12_4_ = uVar29;
              auVar23._4_4_ = tray.org_rdir.field_0._4_4_;
              auVar23._0_4_ = tray.org_rdir.field_0._0_4_;
              auVar23._8_4_ = tray.org_rdir.field_0._8_4_;
              auVar23._12_4_ = tray.org_rdir.field_0._12_4_;
              auVar68 = vfmsub213ps_fma(auVar47,(undefined1  [16])
                                                tray.rdir.field_0.field_0.x.field_0,auVar23);
              uVar29 = *(undefined4 *)(root.ptr + 0x80 + lVar31 * 4);
              auVar76._4_4_ = uVar29;
              auVar76._0_4_ = uVar29;
              auVar76._8_4_ = uVar29;
              auVar76._12_4_ = uVar29;
              auVar24._4_4_ = tray.org_rdir.field_0._20_4_;
              auVar24._0_4_ = tray.org_rdir.field_0._16_4_;
              auVar24._8_4_ = tray.org_rdir.field_0._24_4_;
              auVar24._12_4_ = tray.org_rdir.field_0._28_4_;
              auVar48 = vfmsub213ps_fma(auVar76,(undefined1  [16])
                                                tray.rdir.field_0.field_0.y.field_0,auVar24);
              uVar29 = *(undefined4 *)(root.ptr + 0xc0 + lVar31 * 4);
              auVar81._4_4_ = uVar29;
              auVar81._0_4_ = uVar29;
              auVar81._8_4_ = uVar29;
              auVar81._12_4_ = uVar29;
              auVar25._4_4_ = tray.org_rdir.field_0._36_4_;
              auVar25._0_4_ = tray.org_rdir.field_0._32_4_;
              auVar25._8_4_ = tray.org_rdir.field_0._40_4_;
              auVar25._12_4_ = tray.org_rdir.field_0._44_4_;
              auVar69 = vfmsub213ps_fma(auVar81,(undefined1  [16])
                                                tray.rdir.field_0.field_0.z.field_0,auVar25);
              uVar29 = *(undefined4 *)(root.ptr + 0x60 + lVar31 * 4);
              auVar88._4_4_ = uVar29;
              auVar88._0_4_ = uVar29;
              auVar88._8_4_ = uVar29;
              auVar88._12_4_ = uVar29;
              auVar74 = vfmsub213ps_fma(auVar88,(undefined1  [16])
                                                tray.rdir.field_0.field_0.x.field_0,auVar23);
              uVar29 = *(undefined4 *)(root.ptr + 0xa0 + lVar31 * 4);
              auVar70._4_4_ = uVar29;
              auVar70._0_4_ = uVar29;
              auVar70._8_4_ = uVar29;
              auVar70._12_4_ = uVar29;
              auVar75 = vfmsub213ps_fma(auVar70,(undefined1  [16])
                                                tray.rdir.field_0.field_0.y.field_0,auVar24);
              uVar29 = *(undefined4 *)(root.ptr + 0xe0 + lVar31 * 4);
              auVar56._4_4_ = uVar29;
              auVar56._0_4_ = uVar29;
              auVar56._8_4_ = uVar29;
              auVar56._12_4_ = uVar29;
              auVar79 = vfmsub213ps_fma(auVar56,(undefined1  [16])
                                                tray.rdir.field_0.field_0.z.field_0,auVar25);
              auVar61 = vpminsd_avx(auVar68,auVar74);
              auVar63 = vpminsd_avx(auVar48,auVar75);
              auVar61 = vpmaxsd_avx(auVar61,auVar63);
              auVar63 = vpminsd_avx(auVar69,auVar79);
              auVar63 = vpmaxsd_avx(auVar61,auVar63);
              auVar61 = vpmaxsd_avx(auVar68,auVar74);
              auVar68 = vpmaxsd_avx(auVar48,auVar75);
              auVar68 = vpminsd_avx(auVar61,auVar68);
              auVar61 = vpmaxsd_avx(auVar69,auVar79);
              auVar68 = vpminsd_avx(auVar68,auVar61);
              auVar61 = vpmaxsd_avx(auVar63,(undefined1  [16])tray.tnear.field_0);
              auVar68 = vpminsd_avx(auVar68,(undefined1  [16])tray.tfar.field_0);
              auVar61 = vcmpps_avx(auVar61,auVar68,2);
              auVar55 = ZEXT1664(auVar61);
              sVar26 = sVar33;
              aVar10 = aVar100;
              if (((((auVar61 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                    (auVar61 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                   (auVar61 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                   auVar61[0xf] < '\0') &&
                 (aVar10.v = (__m128)vblendvps_avx(auVar99._0_16_,auVar63,auVar61), sVar26 = sVar9,
                 sVar33 != 8)) {
                pNVar37->ptr = sVar33;
                pNVar37 = pNVar37 + 1;
                *paVar35 = aVar100;
                paVar35 = paVar35 + 1;
              }
              aVar100 = aVar10;
              sVar33 = sVar26;
            }
            if (sVar33 == 8) goto LAB_0163b62f;
            auVar61 = vcmpps_avx((undefined1  [16])tray.tfar.field_0,(undefined1  [16])aVar100,6);
            uVar29 = vmovmskps_avx(auVar61);
            root.ptr = sVar33;
          } while ((byte)uVar32 < (byte)POPCOUNT(uVar29));
          pNVar37->ptr = sVar33;
          pNVar37 = pNVar37 + 1;
          *paVar35 = aVar100;
          paVar35 = paVar35 + 1;
LAB_0163b62f:
          iVar30 = 4;
        }
        else {
          while (uVar38 != 0) {
            sVar33 = 0;
            for (uVar19 = uVar38; (uVar19 & 1) == 0; uVar19 = uVar19 >> 1 | 0x8000000000000000) {
              sVar33 = sVar33 + 1;
            }
            uVar38 = uVar38 - 1 & uVar38;
            bVar27 = occluded1(This,bvh,root,sVar33,&pre,ray,&tray,context);
            if (bVar27) {
              terminated.field_0.i[sVar33] = -1;
            }
          }
          auVar61 = _DAT_01f46b70 & ~(undefined1  [16])terminated.field_0;
          iVar30 = 3;
          auVar99 = ZEXT1664(CONCAT412(0x7f800000,CONCAT48(0x7f800000,0x7f8000007f800000)));
          if ((((auVar61 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
               (auVar61 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
              (auVar61 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
              auVar61[0xf] < '\0') {
            auVar55 = ZEXT1664((undefined1  [16])tray.tfar.field_0);
            auVar61._8_4_ = 0xff800000;
            auVar61._0_8_ = 0xff800000ff800000;
            auVar61._12_4_ = 0xff800000;
            tray.tfar.field_0 =
                 (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
                 vblendvps_avx((undefined1  [16])tray.tfar.field_0,auVar61,
                               (undefined1  [16])terminated.field_0);
            iVar30 = 2;
          }
          if (uVar32 < uVar28) goto LAB_0163b4b3;
        }
      } while (iVar30 != 3);
LAB_0163bde6:
      auVar11 = vandps_avx(auVar11,(undefined1  [16])terminated.field_0);
      auVar54._8_4_ = 0xff800000;
      auVar54._0_8_ = 0xff800000ff800000;
      auVar54._12_4_ = 0xff800000;
      auVar11 = vmaskmovps_avx(auVar11,auVar54);
      *(undefined1 (*) [16])(ray + 0x80) = auVar11;
    }
  }
  return;
LAB_0163b726:
  do {
    lVar34 = -0x10;
    auVar61 = auVar55._0_16_;
    if (lVar31 == (ulong)((uint)root.ptr & 0xf) - 8) break;
    auVar55 = ZEXT1664(local_3788);
    do {
      auVar63 = auVar55._0_16_;
      if ((lVar34 == 0) || (uVar38 = (ulong)*(uint *)(lVar36 + 0x10 + lVar34), uVar38 == 0xffffffff)
         ) break;
      fVar4 = *(float *)(lVar36 + -0xb0 + lVar34);
      auVar77._4_4_ = fVar4;
      auVar77._0_4_ = fVar4;
      auVar77._8_4_ = fVar4;
      auVar77._12_4_ = fVar4;
      fVar5 = *(float *)(lVar36 + -0xa0 + lVar34);
      auVar105._4_4_ = fVar5;
      auVar105._0_4_ = fVar5;
      auVar105._8_4_ = fVar5;
      auVar105._12_4_ = fVar5;
      fVar6 = *(float *)(lVar36 + -0x90 + lVar34);
      auVar106._4_4_ = fVar6;
      auVar106._0_4_ = fVar6;
      auVar106._8_4_ = fVar6;
      auVar106._12_4_ = fVar6;
      local_3738._4_4_ = *(float *)(lVar36 + -0x80 + lVar34);
      local_3748._4_4_ = *(float *)(lVar36 + -0x70 + lVar34);
      fVar7 = *(float *)(lVar36 + -0x60 + lVar34);
      local_3758._4_4_ = *(float *)(lVar36 + -0x10 + lVar34);
      fVar8 = *(float *)(lVar36 + lVar34);
      local_3738._0_4_ = local_3738._4_4_;
      fStack_3730 = (float)local_3738._4_4_;
      fStack_372c = (float)local_3738._4_4_;
      fVar16 = fVar4 - (float)local_3738._4_4_;
      auVar96._4_4_ = fVar16;
      auVar96._0_4_ = fVar16;
      auVar96._8_4_ = fVar16;
      auVar96._12_4_ = fVar16;
      local_3748._0_4_ = local_3748._4_4_;
      fStack_3740 = (float)local_3748._4_4_;
      fStack_373c = (float)local_3748._4_4_;
      fVar17 = fVar5 - (float)local_3748._4_4_;
      fVar18 = fVar6 - fVar7;
      auVar48._4_4_ = fVar18;
      auVar48._0_4_ = fVar18;
      auVar48._8_4_ = fVar18;
      auVar48._12_4_ = fVar18;
      local_3758._0_4_ = local_3758._4_4_;
      fStack_3750 = (float)local_3758._4_4_;
      fStack_374c = (float)local_3758._4_4_;
      fVar5 = (float)local_3758._4_4_ - fVar5;
      auVar108._4_4_ = fVar5;
      auVar108._0_4_ = fVar5;
      auVar108._8_4_ = fVar5;
      auVar108._12_4_ = fVar5;
      fVar6 = fVar8 - fVar6;
      fVar16 = fVar16 * fVar5;
      auVar101._4_4_ = fVar6;
      auVar101._0_4_ = fVar6;
      auVar101._8_4_ = fVar6;
      auVar101._12_4_ = fVar6;
      fVar5 = fVar6 * fVar17;
      auVar80._4_4_ = fVar5;
      auVar80._0_4_ = fVar5;
      auVar80._8_4_ = fVar5;
      auVar80._12_4_ = fVar5;
      auVar79 = vfmsub231ps_fma(auVar80,auVar108,auVar48);
      fVar5 = *(float *)(lVar36 + -0x20 + lVar34);
      fVar4 = fVar5 - fVar4;
      fVar15 = fVar4 * fVar18;
      auVar71._4_4_ = fVar15;
      auVar71._0_4_ = fVar15;
      auVar71._8_4_ = fVar15;
      auVar71._12_4_ = fVar15;
      auVar94 = vfmsub231ps_fma(auVar71,auVar101,auVar96);
      auVar68 = vsubps_avx(auVar77,*(undefined1 (*) [16])ray);
      auVar48 = vsubps_avx(auVar105,*(undefined1 (*) [16])(ray + 0x10));
      auVar69 = vsubps_avx(auVar106,*(undefined1 (*) [16])(ray + 0x20));
      fVar62 = (float)*(undefined8 *)pRVar2;
      auVar111._0_4_ = fVar62 * auVar68._0_4_;
      fVar65 = (float)((ulong)*(undefined8 *)pRVar2 >> 0x20);
      auVar111._4_4_ = fVar65 * auVar68._4_4_;
      fVar66 = (float)*(undefined8 *)(ray + 0x68);
      auVar111._8_4_ = fVar66 * auVar68._8_4_;
      fVar67 = (float)((ulong)*(undefined8 *)(ray + 0x68) >> 0x20);
      auVar111._12_4_ = fVar67 * auVar68._12_4_;
      auVar95 = vfmsub231ps_fma(auVar111,auVar69,*(undefined1 (*) [16])pRVar3);
      fVar15 = (float)*(undefined8 *)pRVar3;
      auVar86._0_4_ = auVar48._0_4_ * fVar15;
      fVar12 = (float)((ulong)*(undefined8 *)pRVar3 >> 0x20);
      auVar86._4_4_ = auVar48._4_4_ * fVar12;
      fVar13 = (float)*(undefined8 *)(ray + 0x48);
      auVar86._8_4_ = auVar48._8_4_ * fVar13;
      fVar14 = (float)((ulong)*(undefined8 *)(ray + 0x48) >> 0x20);
      auVar86._12_4_ = auVar48._12_4_ * fVar14;
      auVar71 = vfmsub231ps_fma(auVar86,auVar68,*(undefined1 (*) [16])pRVar1);
      auVar102._0_4_ = fVar6 * auVar71._0_4_;
      auVar102._4_4_ = fVar6 * auVar71._4_4_;
      auVar102._8_4_ = fVar6 * auVar71._8_4_;
      auVar102._12_4_ = fVar6 * auVar71._12_4_;
      auVar61 = vfmadd231ps_fma(auVar102,auVar95,auVar108);
      auVar97._4_4_ = fVar17;
      auVar97._0_4_ = fVar17;
      auVar97._8_4_ = fVar17;
      auVar97._12_4_ = fVar17;
      auVar39._4_4_ = fVar4;
      auVar39._0_4_ = fVar4;
      auVar39._8_4_ = fVar4;
      auVar39._12_4_ = fVar4;
      auVar82._4_4_ = fVar16;
      auVar82._0_4_ = fVar16;
      auVar82._8_4_ = fVar16;
      auVar82._12_4_ = fVar16;
      auVar77 = vfmsub231ps_fma(auVar82,auVar39,auVar97);
      fVar4 = (float)*(undefined8 *)pRVar1;
      auVar98._0_4_ = auVar69._0_4_ * fVar4;
      fVar6 = (float)((ulong)*(undefined8 *)pRVar1 >> 0x20);
      auVar98._4_4_ = auVar69._4_4_ * fVar6;
      fVar16 = (float)*(undefined8 *)(ray + 0x58);
      auVar98._8_4_ = auVar69._8_4_ * fVar16;
      fVar17 = (float)((ulong)*(undefined8 *)(ray + 0x58) >> 0x20);
      auVar98._12_4_ = auVar69._12_4_ * fVar17;
      auVar80 = vfmsub231ps_fma(auVar98,auVar48,*(undefined1 (*) [16])pRVar2);
      auVar74 = vfmadd231ps_fma(auVar61,auVar80,auVar39);
      auVar109._0_4_ = auVar77._0_4_ * fVar62;
      auVar109._4_4_ = auVar77._4_4_ * fVar65;
      auVar109._8_4_ = auVar77._8_4_ * fVar66;
      auVar109._12_4_ = auVar77._12_4_ * fVar67;
      auVar61 = vfmadd231ps_fma(auVar109,auVar94,*(undefined1 (*) [16])pRVar1);
      auVar75 = vfmadd231ps_fma(auVar61,auVar79,*(undefined1 (*) [16])pRVar3);
      auVar49._8_4_ = 0x80000000;
      auVar49._0_8_ = 0x8000000080000000;
      auVar49._12_4_ = 0x80000000;
      auVar61 = vandps_avx(auVar75,auVar49);
      uVar28 = auVar61._0_4_;
      auVar103._0_4_ = uVar28 ^ auVar74._0_4_;
      uVar91 = auVar61._4_4_;
      auVar103._4_4_ = uVar91 ^ auVar74._4_4_;
      uVar92 = auVar61._8_4_;
      auVar103._8_4_ = uVar92 ^ auVar74._8_4_;
      uVar93 = auVar61._12_4_;
      auVar103._12_4_ = uVar93 ^ auVar74._12_4_;
      auVar61 = vcmpps_avx(auVar103,_DAT_01f45a50,5);
      auVar74 = auVar63 & auVar61;
      local_36d8 = (float)*(undefined8 *)(ray + 0x30);
      fStack_36d4 = (float)((ulong)*(undefined8 *)(ray + 0x30) >> 0x20);
      fStack_36d0 = (float)*(undefined8 *)(ray + 0x38);
      fStack_36cc = (float)((ulong)*(undefined8 *)(ray + 0x38) >> 0x20);
      local_36e8 = (float)*(undefined8 *)(ray + 0x80);
      fStack_36e4 = (float)((ulong)*(undefined8 *)(ray + 0x80) >> 0x20);
      fStack_36e0 = (float)*(undefined8 *)(ray + 0x88);
      fStack_36dc = (float)((ulong)*(undefined8 *)(ray + 0x88) >> 0x20);
      if ((((auVar74 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
           (auVar74 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
          (auVar74 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) || auVar74[0xf] < '\0'
         ) {
        auVar61 = vandps_avx(auVar61,auVar63);
        auVar41._0_4_ = auVar71._0_4_ * fVar18;
        auVar41._4_4_ = auVar71._4_4_ * fVar18;
        auVar41._8_4_ = auVar71._8_4_ * fVar18;
        auVar41._12_4_ = auVar71._12_4_ * fVar18;
        auVar74 = vfmadd213ps_fma(auVar97,auVar95,auVar41);
        auVar74 = vfmadd213ps_fma(auVar96,auVar80,auVar74);
        auVar64._0_4_ = uVar28 ^ auVar74._0_4_;
        auVar64._4_4_ = uVar91 ^ auVar74._4_4_;
        auVar64._8_4_ = uVar92 ^ auVar74._8_4_;
        auVar64._12_4_ = uVar93 ^ auVar74._12_4_;
        auVar74 = vcmpps_avx(auVar64,_DAT_01f45a50,5);
        auVar95 = auVar61 & auVar74;
        if ((((auVar95 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
             (auVar95 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
            (auVar95 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
            auVar95[0xf] < '\0') {
          auVar95 = vandps_avx(auVar75,auVar104);
          auVar61 = vandps_avx(auVar74,auVar61);
          auVar74 = vsubps_avx(auVar95,auVar103);
          auVar74 = vcmpps_avx(auVar74,auVar64,5);
          auVar71 = auVar61 & auVar74;
          if ((((auVar71 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
               (auVar71 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
              (auVar71 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
              auVar71[0xf] < '\0') {
            auVar61 = vandps_avx(auVar61,auVar74);
            auVar43._0_4_ = auVar69._0_4_ * auVar77._0_4_;
            auVar43._4_4_ = auVar69._4_4_ * auVar77._4_4_;
            auVar43._8_4_ = auVar69._8_4_ * auVar77._8_4_;
            auVar43._12_4_ = auVar69._12_4_ * auVar77._12_4_;
            auVar48 = vfmadd213ps_fma(auVar48,auVar94,auVar43);
            auVar68 = vfmadd132ps_fma(auVar68,auVar48,auVar79);
            auVar44._0_4_ = uVar28 ^ auVar68._0_4_;
            auVar44._4_4_ = uVar91 ^ auVar68._4_4_;
            auVar44._8_4_ = uVar92 ^ auVar68._8_4_;
            auVar44._12_4_ = uVar93 ^ auVar68._12_4_;
            auVar60._0_4_ = auVar95._0_4_ * local_36d8;
            auVar60._4_4_ = auVar95._4_4_ * fStack_36d4;
            auVar60._8_4_ = auVar95._8_4_ * fStack_36d0;
            auVar60._12_4_ = auVar95._12_4_ * fStack_36cc;
            auVar68 = vcmpps_avx(auVar60,auVar44,1);
            auVar52._0_4_ = auVar95._0_4_ * local_36e8;
            auVar52._4_4_ = auVar95._4_4_ * fStack_36e4;
            auVar52._8_4_ = auVar95._8_4_ * fStack_36e0;
            auVar52._12_4_ = auVar95._12_4_ * fStack_36dc;
            auVar48 = vcmpps_avx(auVar44,auVar52,2);
            auVar68 = vandps_avx(auVar48,auVar68);
            auVar48 = auVar61 & auVar68;
            if ((((auVar48 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                 (auVar48 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                (auVar48 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                auVar48[0xf] < '\0') {
              auVar61 = vandps_avx(auVar68,auVar61);
              auVar68 = vcmpps_avx(auVar75,_DAT_01f45a50,4);
              auVar48 = auVar61 & auVar68;
              if ((((auVar48 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                   (auVar48 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                  (auVar48 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                  auVar48[0xf] < '\0') {
                uVar28 = ((context->scene->geometries).items[uVar38].ptr)->mask;
                auVar45._4_4_ = uVar28;
                auVar45._0_4_ = uVar28;
                auVar45._8_4_ = uVar28;
                auVar45._12_4_ = uVar28;
                auVar61 = vandps_avx(auVar68,auVar61);
                auVar68 = vpand_avx(auVar45,*(undefined1 (*) [16])(ray + 0x90));
                auVar68 = vpcmpeqd_avx(auVar68,_DAT_01f45a50);
                auVar48 = auVar61 & ~auVar68;
                if ((((auVar48 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                     (auVar48 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                    (auVar48 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                    auVar48[0xf] < '\0') {
                  auVar61 = vandnps_avx(auVar68,auVar61);
                  auVar63 = vandnps_avx(auVar61,auVar63);
                }
              }
            }
          }
        }
      }
      if ((((auVar63 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
           (auVar63 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
          (auVar63 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) && -1 < auVar63[0xf])
      {
        auVar99 = ZEXT1664(CONCAT412(0x7f800000,CONCAT48(0x7f800000,0x7f8000007f800000)));
        break;
      }
      uVar29 = *(undefined4 *)(lVar36 + -0x50 + lVar34);
      auVar40._4_4_ = uVar29;
      auVar40._0_4_ = uVar29;
      auVar40._8_4_ = uVar29;
      auVar40._12_4_ = uVar29;
      uVar29 = *(undefined4 *)(lVar36 + -0x40 + lVar34);
      auVar78._4_4_ = uVar29;
      auVar78._0_4_ = uVar29;
      auVar78._8_4_ = uVar29;
      auVar78._12_4_ = uVar29;
      uVar29 = *(undefined4 *)(lVar36 + -0x30 + lVar34);
      auVar83._4_4_ = uVar29;
      auVar83._0_4_ = uVar29;
      auVar83._8_4_ = uVar29;
      auVar83._12_4_ = uVar29;
      auVar20._4_4_ = fVar5;
      auVar20._0_4_ = fVar5;
      auVar20._8_4_ = fVar5;
      auVar20._12_4_ = fVar5;
      auVar68 = vsubps_avx(auVar40,auVar20);
      auVar48 = vsubps_avx(auVar78,_local_3758);
      auVar21._4_4_ = fVar8;
      auVar21._0_4_ = fVar8;
      auVar21._8_4_ = fVar8;
      auVar21._12_4_ = fVar8;
      auVar69 = vsubps_avx(auVar83,auVar21);
      auVar74 = vsubps_avx(_local_3738,auVar40);
      auVar61 = vsubps_avx(_local_3748,auVar78);
      auVar22._4_4_ = fVar7;
      auVar22._0_4_ = fVar7;
      auVar22._8_4_ = fVar7;
      auVar22._12_4_ = fVar7;
      auVar75 = vsubps_avx(auVar22,auVar83);
      auVar50._0_4_ = auVar75._0_4_ * auVar48._0_4_;
      auVar50._4_4_ = auVar75._4_4_ * auVar48._4_4_;
      auVar50._8_4_ = auVar75._8_4_ * auVar48._8_4_;
      auVar50._12_4_ = auVar75._12_4_ * auVar48._12_4_;
      auVar77 = vfmsub231ps_fma(auVar50,auVar61,auVar69);
      auVar57._0_4_ = auVar69._0_4_ * auVar74._0_4_;
      auVar57._4_4_ = auVar69._4_4_ * auVar74._4_4_;
      auVar57._8_4_ = auVar69._8_4_ * auVar74._8_4_;
      auVar57._12_4_ = auVar69._12_4_ * auVar74._12_4_;
      auVar80 = vfmsub231ps_fma(auVar57,auVar75,auVar68);
      auVar72._0_4_ = auVar61._0_4_ * auVar68._0_4_;
      auVar72._4_4_ = auVar61._4_4_ * auVar68._4_4_;
      auVar72._8_4_ = auVar61._8_4_ * auVar68._8_4_;
      auVar72._12_4_ = auVar61._12_4_ * auVar68._12_4_;
      auVar39 = vfmsub231ps_fma(auVar72,auVar74,auVar48);
      auVar79 = vsubps_avx(auVar40,*(undefined1 (*) [16])ray);
      auVar94 = vsubps_avx(auVar78,*(undefined1 (*) [16])(ray + 0x10));
      auVar95 = vsubps_avx(auVar83,*(undefined1 (*) [16])(ray + 0x20));
      auVar84._0_4_ = auVar95._0_4_ * fVar4;
      auVar84._4_4_ = auVar95._4_4_ * fVar6;
      auVar84._8_4_ = auVar95._8_4_ * fVar16;
      auVar84._12_4_ = auVar95._12_4_ * fVar17;
      auVar82 = vfmsub231ps_fma(auVar84,auVar94,*(undefined1 (*) [16])pRVar2);
      auVar87._0_4_ = auVar79._0_4_ * fVar62;
      auVar87._4_4_ = auVar79._4_4_ * fVar65;
      auVar87._8_4_ = auVar79._8_4_ * fVar66;
      auVar87._12_4_ = auVar79._12_4_ * fVar67;
      auVar86 = vfmsub231ps_fma(auVar87,auVar95,*(undefined1 (*) [16])pRVar3);
      auVar89._0_4_ = fVar15 * auVar94._0_4_;
      auVar89._4_4_ = fVar12 * auVar94._4_4_;
      auVar89._8_4_ = fVar13 * auVar94._8_4_;
      auVar89._12_4_ = fVar14 * auVar94._12_4_;
      auVar96 = vfmsub231ps_fma(auVar89,auVar79,*(undefined1 (*) [16])pRVar1);
      auVar112._0_4_ = auVar75._0_4_ * auVar96._0_4_;
      auVar112._4_4_ = auVar75._4_4_ * auVar96._4_4_;
      auVar112._8_4_ = auVar75._8_4_ * auVar96._8_4_;
      auVar112._12_4_ = auVar75._12_4_ * auVar96._12_4_;
      auVar75 = vfmadd231ps_fma(auVar112,auVar86,auVar61);
      auVar107._0_4_ = auVar39._0_4_ * fVar62;
      auVar107._4_4_ = auVar39._4_4_ * fVar65;
      auVar107._8_4_ = auVar39._8_4_ * fVar66;
      auVar107._12_4_ = auVar39._12_4_ * fVar67;
      auVar61 = vfmadd231ps_fma(auVar107,auVar80,*(undefined1 (*) [16])pRVar1);
      auVar71 = vfmadd231ps_fma(auVar61,auVar77,*(undefined1 (*) [16])pRVar3);
      auVar55 = ZEXT1664(auVar63);
      auVar61 = vandps_avx(auVar71,auVar49);
      auVar74 = vfmadd231ps_fma(auVar75,auVar82,auVar74);
      uVar28 = auVar61._0_4_;
      auVar110._0_4_ = auVar74._0_4_ ^ uVar28;
      uVar91 = auVar61._4_4_;
      auVar110._4_4_ = auVar74._4_4_ ^ uVar91;
      uVar92 = auVar61._8_4_;
      auVar110._8_4_ = auVar74._8_4_ ^ uVar92;
      uVar93 = auVar61._12_4_;
      auVar110._12_4_ = auVar74._12_4_ ^ uVar93;
      auVar61 = vcmpps_avx(auVar110,_DAT_01f45a50,5);
      auVar74 = auVar63 & auVar61;
      if ((((auVar74 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
           (auVar74 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
          (auVar74 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) && -1 < auVar74[0xf])
      {
LAB_0163ba0b:
        auVar99 = ZEXT1664(CONCAT412(0x7f800000,CONCAT48(0x7f800000,0x7f8000007f800000)));
      }
      else {
        auVar61 = vandps_avx(auVar61,auVar63);
        auVar90._0_4_ = auVar69._0_4_ * auVar96._0_4_;
        auVar90._4_4_ = auVar69._4_4_ * auVar96._4_4_;
        auVar90._8_4_ = auVar69._8_4_ * auVar96._8_4_;
        auVar90._12_4_ = auVar69._12_4_ * auVar96._12_4_;
        auVar48 = vfmadd213ps_fma(auVar48,auVar86,auVar90);
        auVar68 = vfmadd213ps_fma(auVar68,auVar82,auVar48);
        auVar85._0_4_ = uVar28 ^ auVar68._0_4_;
        auVar85._4_4_ = uVar91 ^ auVar68._4_4_;
        auVar85._8_4_ = uVar92 ^ auVar68._8_4_;
        auVar85._12_4_ = uVar93 ^ auVar68._12_4_;
        auVar68 = vcmpps_avx(auVar85,_DAT_01f45a50,5);
        auVar48 = auVar61 & auVar68;
        if ((((auVar48 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
             (auVar48 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
            (auVar48 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) && -1 < auVar48[0xf]
           ) goto LAB_0163ba0b;
        auVar48 = vandps_avx(auVar71,auVar104);
        auVar61 = vandps_avx(auVar68,auVar61);
        auVar68 = vsubps_avx(auVar48,auVar110);
        auVar68 = vcmpps_avx(auVar68,auVar85,5);
        auVar69 = auVar61 & auVar68;
        if ((((auVar69 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
             (auVar69 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
            (auVar69 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) && -1 < auVar69[0xf]
           ) goto LAB_0163ba0b;
        auVar61 = vandps_avx(auVar61,auVar68);
        auVar73._0_4_ = auVar95._0_4_ * auVar39._0_4_;
        auVar73._4_4_ = auVar95._4_4_ * auVar39._4_4_;
        auVar73._8_4_ = auVar95._8_4_ * auVar39._8_4_;
        auVar73._12_4_ = auVar95._12_4_ * auVar39._12_4_;
        auVar68 = vfmadd213ps_fma(auVar94,auVar80,auVar73);
        auVar68 = vfmadd213ps_fma(auVar79,auVar77,auVar68);
        auVar42._0_4_ = auVar68._0_4_ ^ uVar28;
        auVar42._4_4_ = auVar68._4_4_ ^ uVar91;
        auVar42._8_4_ = auVar68._8_4_ ^ uVar92;
        auVar42._12_4_ = auVar68._12_4_ ^ uVar93;
        auVar51._0_4_ = auVar48._0_4_ * local_36d8;
        auVar51._4_4_ = auVar48._4_4_ * fStack_36d4;
        auVar51._8_4_ = auVar48._8_4_ * fStack_36d0;
        auVar51._12_4_ = auVar48._12_4_ * fStack_36cc;
        auVar68 = vcmpps_avx(auVar51,auVar42,1);
        auVar58._0_4_ = auVar48._0_4_ * local_36e8;
        auVar58._4_4_ = auVar48._4_4_ * fStack_36e4;
        auVar58._8_4_ = auVar48._8_4_ * fStack_36e0;
        auVar58._12_4_ = auVar48._12_4_ * fStack_36dc;
        auVar48 = vcmpps_avx(auVar42,auVar58,2);
        auVar68 = vandps_avx(auVar48,auVar68);
        auVar48 = auVar61 & auVar68;
        if ((((auVar48 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
             (auVar48 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
            (auVar48 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) && -1 < auVar48[0xf]
           ) {
LAB_0163bc55:
          auVar99 = ZEXT1664(CONCAT412(0x7f800000,CONCAT48(0x7f800000,0x7f8000007f800000)));
          auVar55 = ZEXT1664(auVar63);
        }
        else {
          auVar61 = vandps_avx(auVar68,auVar61);
          auVar68 = vcmpps_avx(auVar71,_DAT_01f45a50,4);
          auVar48 = auVar61 & auVar68;
          if ((((auVar48 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
               (auVar48 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
              (auVar48 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
              -1 < auVar48[0xf]) goto LAB_0163bc55;
          uVar28 = ((context->scene->geometries).items[uVar38].ptr)->mask;
          auVar59._4_4_ = uVar28;
          auVar59._0_4_ = uVar28;
          auVar59._8_4_ = uVar28;
          auVar59._12_4_ = uVar28;
          auVar61 = vandps_avx(auVar68,auVar61);
          auVar68 = vpand_avx(auVar59,*(undefined1 (*) [16])(ray + 0x90));
          auVar68 = vpcmpeqd_avx(auVar68,_DAT_01f45a50);
          auVar48 = auVar61 & ~auVar68;
          if ((((auVar48 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
               (auVar48 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
              (auVar48 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
              -1 < auVar48[0xf]) goto LAB_0163bc55;
          auVar61 = vandnps_avx(auVar68,auVar61);
          auVar61 = vandnps_avx(auVar61,auVar63);
          auVar55 = ZEXT1664(auVar61);
          auVar99 = ZEXT1664(CONCAT412(0x7f800000,CONCAT48(0x7f800000,0x7f8000007f800000)));
        }
      }
      lVar34 = lVar34 + 4;
      auVar63 = auVar55._0_16_;
    } while ((((auVar63 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
              (auVar63 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
             (auVar63 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
             auVar55[0xf] < '\0');
    auVar55 = ZEXT1664(local_3788);
    auVar68 = vandps_avx(auVar63,local_3788);
    lVar31 = lVar31 + 1;
    lVar36 = lVar36 + 0xe0;
    auVar63 = local_3788 & auVar63;
    auVar61 = local_3788;
    local_3788 = auVar68;
  } while ((((auVar63 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
            (auVar63 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
           (auVar63 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
           auVar63[0xf] < '\0');
  auVar61 = vpcmpeqd_avx(auVar61,auVar61);
  auVar46._0_4_ = local_3788._0_4_ ^ auVar61._0_4_;
  auVar46._4_4_ = local_3788._4_4_ ^ auVar61._4_4_;
  auVar46._8_4_ = local_3788._8_4_ ^ auVar61._8_4_;
  auVar46._12_4_ = local_3788._12_4_ ^ auVar61._12_4_;
  terminated.field_0 =
       (anon_union_16_2_9473010e_for_vboolf_impl<4>_1)
       vorps_avx(auVar46,(undefined1  [16])terminated.field_0);
  auVar61 = auVar61 & ~(undefined1  [16])terminated.field_0;
  if ((((auVar61 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
       (auVar61 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
      (auVar61 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) && -1 < auVar61[0xf])
  goto LAB_0163bde6;
  auVar53._8_4_ = 0xff800000;
  auVar53._0_8_ = 0xff800000ff800000;
  auVar53._12_4_ = 0xff800000;
  auVar55 = ZEXT1664(auVar53);
  tray.tfar.field_0 =
       (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
       vblendvps_avx((undefined1  [16])tray.tfar.field_0,auVar53,
                     (undefined1  [16])terminated.field_0);
  goto LAB_0163b46e;
}

Assistant:

void BVHNIntersectorKHybrid<N, K, types, robust, PrimitiveIntersectorK, single>::occluded(vint<K>* __restrict__ valid_i,
                                                                                              Accel::Intersectors* __restrict__ This,
                                                                                              RayK<K>& __restrict__ ray,
                                                                                              RayQueryContext* context)
    {
      BVH* __restrict__ bvh = (BVH*)This->ptr;
      
      /* we may traverse an empty BVH in case all geometry was invalid */
      if (bvh->root == BVH::emptyNode)
        return;
      
#if ENABLE_FAST_COHERENT_CODEPATHS == 1
      assert(context);
      if (unlikely(types == BVH_AN1 && context->user && context->isCoherent()))
      {
        occludedCoherent(valid_i, This, ray, context);
        return;
      }
#endif

      /* filter out already occluded and invalid rays */
      vbool<K> valid = (*valid_i == -1) & (ray.tfar >= 0.0f);
#if defined(EMBREE_IGNORE_INVALID_RAYS)
      valid &= ray.valid();
#endif

      /* return if there are no valid rays */
      const size_t valid_bits = movemask(valid);
      if (unlikely(valid_bits == 0)) return;

      /* verify correct input */
      assert(all(valid, ray.valid()));
      assert(all(valid, ray.tnear() >= 0.0f));
      assert(!(types & BVH_MB) || all(valid, (ray.time() >= 0.0f) & (ray.time() <= 1.0f)));
      Precalculations pre(valid, ray);

      /* load ray */
      TravRayK<K, robust> tray(ray.org, ray.dir, single ? N : 0);
      const vfloat<K> org_ray_tnear = max(ray.tnear(), 0.0f);
      const vfloat<K> org_ray_tfar  = max(ray.tfar , 0.0f);

      tray.tnear = select(valid, org_ray_tnear, vfloat<K>(pos_inf));
      tray.tfar  = select(valid, org_ray_tfar , vfloat<K>(neg_inf));

      vbool<K> terminated = !valid;
      const vfloat<K> inf = vfloat<K>(pos_inf);

      /* determine switch threshold based on flags */
      const size_t switchThreshold = (context->user && context->isCoherent()) ? 2 : switchThresholdIncoherent;

      /* allocate stack and push root node */
      vfloat<K> stack_near[stackSizeChunk];
      NodeRef stack_node[stackSizeChunk];
      stack_node[0] = BVH::invalidNode;
      stack_near[0] = inf;
      stack_node[1] = bvh->root;
      stack_near[1] = tray.tnear;
      NodeRef* stackEnd MAYBE_UNUSED = stack_node+stackSizeChunk;
      NodeRef* __restrict__ sptr_node = stack_node + 2;
      vfloat<K>* __restrict__ sptr_near = stack_near + 2;

      while (1) pop:
      {
        /* pop next node from stack */
        assert(sptr_node > stack_node);
        sptr_node--;
        sptr_near--;
        NodeRef cur = *sptr_node;
        if (unlikely(cur == BVH::invalidNode)) {
          assert(sptr_node == stack_node);
          break;
        }

        /* cull node if behind closest hit point */
        vfloat<K> curDist = *sptr_near;
        const vbool<K> active = curDist < tray.tfar;
        if (unlikely(none(active)))
          continue;

        /* switch to single ray traversal */
#if (!defined(__WIN32__) || defined(__X86_64__)) && ((defined(__aarch64__)) || defined(__SSE4_2__))
#if FORCE_SINGLE_MODE == 0
        if (single)
#endif
        {
          size_t bits = movemask(active);
#if FORCE_SINGLE_MODE == 0
          if (unlikely(popcnt(bits) <= switchThreshold)) 
#endif
          {
            for (; bits!=0; ) {
              const size_t i = bscf(bits);
              if (occluded1(This, bvh, cur, i, pre, ray, tray, context))
                set(terminated, i);
            }
            if (all(terminated)) break;
            tray.tfar = select(terminated, vfloat<K>(neg_inf), tray.tfar);
            continue;
          }
        }
#endif

        while (likely(!cur.isLeaf()))
        {
          /* process nodes */
          const vbool<K> valid_node = tray.tfar > curDist;
          STAT3(shadow.trav_nodes, 1, popcnt(valid_node), K);
          const NodeRef nodeRef = cur;
          const BaseNode* __restrict__ const node = nodeRef.baseNode();

          /* set cur to invalid */
          cur = BVH::emptyNode;
          curDist = pos_inf;

          for (unsigned i = 0; i < N; i++)
          {
            const NodeRef child = node->children[i];
            if (unlikely(child == BVH::emptyNode)) break;
            vfloat<K> lnearP;
            vbool<K> lhit = valid_node;
            BVHNNodeIntersectorK<N, K, types, robust>::intersect(nodeRef, i, tray, ray.time(), lnearP, lhit);

            /* if we hit the child we push the previously hit node onto the stack, and continue with the currently hit child */
            if (likely(any(lhit)))
            {
              assert(sptr_node < stackEnd);
              assert(child != BVH::emptyNode);
              const vfloat<K> childDist = select(lhit, lnearP, inf);

              /* push 'cur' node onto stack and continue with hit child */
              if (likely(cur != BVH::emptyNode)) {
                *sptr_node = cur; sptr_node++;
                *sptr_near = curDist; sptr_near++;
              }
              curDist = childDist;
              cur = child;
            }
          }
          if (unlikely(cur == BVH::emptyNode))
            goto pop;

#if SWITCH_DURING_DOWN_TRAVERSAL == 1
          if (single)
          {
            // seems to be the best place for testing utilization
            if (unlikely(popcnt(tray.tfar > curDist) <= switchThreshold))
            {
              *sptr_node++ = cur;
              *sptr_near++ = curDist;
              goto pop;
            }
          }
#endif
	}

        /* return if stack is empty */
        if (unlikely(cur == BVH::invalidNode)) {
          assert(sptr_node == stack_node);
          break;
        }


        /* intersect leaf */
        assert(cur != BVH::emptyNode);
        const vbool<K> valid_leaf = tray.tfar > curDist;
        STAT3(shadow.trav_leaves, 1, popcnt(valid_leaf), K);
        if (unlikely(none(valid_leaf))) continue;
        size_t items; const Primitive* prim = (Primitive*) cur.leaf(items);

        size_t lazy_node = 0;
        terminated |= PrimitiveIntersectorK::occluded(!terminated, This, pre, ray, context, prim, items, tray, lazy_node);
        if (all(terminated)) break;
        tray.tfar = select(terminated, vfloat<K>(neg_inf), tray.tfar); // ignore node intersections for terminated rays

        if (unlikely(lazy_node)) {
          *sptr_node = lazy_node; sptr_node++;
          *sptr_near = neg_inf;   sptr_near++;
        }
      }

      vfloat<K>::store(valid & terminated, &ray.tfar, neg_inf);
    }